

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

bool __thiscall cmCTest::UpdateCTestConfiguration(cmCTest *this)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  ulong uVar5;
  ostream *poVar6;
  char *pcVar7;
  long lVar8;
  mapped_type *this_00;
  allocator local_f89;
  string local_f88;
  string local_f68;
  string local_f48 [32];
  undefined1 local_f28 [8];
  ostringstream cmCTestLog_msg_3;
  unsigned_long local_db0;
  unsigned_long load;
  string local_da0;
  string local_d80;
  string *local_d60;
  string *testLoad;
  string local_d50;
  string local_d30;
  allocator local_d09;
  string local_d08;
  string local_ce8;
  allocator local_cc1;
  string local_cc0;
  string local_ca0;
  string local_c80;
  undefined1 local_c60 [8];
  string value;
  string key;
  size_type cpos;
  string local_c10;
  string local_bf0;
  string local_bd0 [39];
  allocator local_ba9;
  string local_ba8;
  undefined1 local_b88 [8];
  string line;
  char buffer [1024];
  long local_760;
  ifstream fin;
  string local_558 [32];
  undefined1 local_538 [8];
  ostringstream cmCTestLog_msg_2;
  string local_3b8 [32];
  undefined1 local_398 [8];
  ostringstream cmCTestLog_msg_1;
  string local_220 [32];
  undefined1 local_200 [8];
  ostringstream cmCTestLog_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38 [8];
  string fileName;
  cmCTest *this_local;
  
  if ((this->SuppressUpdatingCTestConfiguration & 1U) != 0) {
    this_local._7_1_ = 1;
    goto LAB_0053340c;
  }
  fileName.field_2._8_8_ = this;
  std::__cxx11::string::string(local_38,(string *)&this->CTestConfigFile);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) != 0) {
    std::operator+(&local_58,&this->BinaryDir,"/CTestConfiguration.ini");
    std::__cxx11::string::operator=(local_38,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    bVar1 = cmsys::SystemTools::FileExists(pcVar7);
    if (!bVar1) {
      std::operator+(&local_88,&this->BinaryDir,"/DartConfiguration.tcl");
      std::__cxx11::string::operator=(local_38,(string *)&local_88);
      std::__cxx11::string::~string((string *)&local_88);
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
  poVar6 = std::operator<<((ostream *)local_200,"UpdateCTestConfiguration  from :");
  poVar6 = std::operator<<(poVar6,local_38);
  std::operator<<(poVar6,"\n");
  std::__cxx11::ostringstream::str();
  pcVar7 = (char *)std::__cxx11::string::c_str();
  Log(this,4,
      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
      0x27d,pcVar7,false);
  std::__cxx11::string::~string(local_220);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
  pcVar7 = (char *)std::__cxx11::string::c_str();
  bVar1 = cmsys::SystemTools::FileExists(pcVar7);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_538);
    poVar6 = std::operator<<((ostream *)local_538,"Parse Config file:");
    poVar6 = std::operator<<(poVar6,local_38);
    std::operator<<(poVar6,"\n");
    std::__cxx11::ostringstream::str();
    pcVar7 = (char *)std::__cxx11::string::c_str();
    Log(this,4,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x287,pcVar7,false);
    std::__cxx11::string::~string(local_558);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_538);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    std::ifstream::ifstream(&local_760,pcVar7,_S_in);
    bVar3 = std::ios::operator!((ios *)((long)&local_760 + *(long *)(local_760 + -0x18)));
    if ((bVar3 & 1) == 0) {
      while (bVar1 = std::ios::operator_cast_to_bool
                               ((ios *)((long)&local_760 + *(long *)(local_760 + -0x18))), bVar1) {
        line.field_2._M_local_buf[8] = '\0';
        std::istream::getline((char *)&local_760,(long)((long)&line.field_2 + 8));
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_ba8,line.field_2._M_local_buf + 8,&local_ba9);
        CleanString((string *)local_b88,&local_ba8);
        std::__cxx11::string::~string((string *)&local_ba8);
        std::allocator<char>::~allocator((allocator<char> *)&local_ba9);
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          while( true ) {
            bVar2 = std::ios::operator_cast_to_bool
                              ((ios *)((long)&local_760 + *(long *)(local_760 + -0x18)));
            bVar1 = false;
            if (bVar2) {
              std::__cxx11::string::size();
              pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_b88);
              bVar1 = *pcVar7 == '\\';
            }
            if (!bVar1) break;
            std::__cxx11::string::size();
            std::__cxx11::string::substr((ulong)local_bd0,(ulong)local_b88);
            std::__cxx11::string::operator=((string *)local_b88,local_bd0);
            std::__cxx11::string::~string(local_bd0);
            line.field_2._M_local_buf[8] = '\0';
            std::istream::getline((char *)&local_760,(long)((long)&line.field_2 + 8));
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_c10,line.field_2._M_local_buf + 8,
                       (allocator *)((long)&cpos + 7));
            CleanString(&local_bf0,&local_c10);
            std::__cxx11::string::operator+=((string *)local_b88,(string *)&local_bf0);
            std::__cxx11::string::~string((string *)&local_bf0);
            std::__cxx11::string::~string((string *)&local_c10);
            std::allocator<char>::~allocator((allocator<char> *)((long)&cpos + 7));
          }
          pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_b88);
          if ((*pcVar7 != '#') &&
             (lVar8 = std::__cxx11::string::find_first_of((char)local_b88,0x3a), lVar8 != -1)) {
            std::__cxx11::string::substr((ulong)((long)&value.field_2 + 8),(ulong)local_b88);
            std::__cxx11::string::substr((ulong)&local_c80,(ulong)local_b88);
            CleanString((string *)local_c60,&local_c80);
            std::__cxx11::string::~string((string *)&local_c80);
            this_00 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[](&this->CTestConfiguration,(key_type *)((long)&value.field_2 + 8))
            ;
            std::__cxx11::string::operator=((string *)this_00,(string *)local_c60);
            std::__cxx11::string::~string((string *)local_c60);
            std::__cxx11::string::~string((string *)(value.field_2._M_local_buf + 8));
          }
        }
        std::__cxx11::string::~string((string *)local_b88);
      }
      std::ifstream::close();
      bVar1 = false;
    }
    else {
      this_local._7_1_ = 0;
      bVar1 = true;
    }
    std::ifstream::~ifstream(&local_760);
    if (!bVar1) goto LAB_00532e3e;
  }
  else if ((this->ProduceXML & 1U) == 0) {
LAB_00532e3e:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_cc0,"BuildDirectory",&local_cc1);
    GetCTestConfiguration(&local_ca0,this,&local_cc0);
    bVar3 = std::__cxx11::string::empty();
    std::__cxx11::string::~string((string *)&local_ca0);
    std::__cxx11::string::~string((string *)&local_cc0);
    std::allocator<char>::~allocator((allocator<char> *)&local_cc1);
    if (((bVar3 ^ 0xff) & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_d08,"BuildDirectory",&local_d09);
      GetCTestConfiguration(&local_ce8,this,&local_d08);
      std::__cxx11::string::operator=((string *)&this->BinaryDir,(string *)&local_ce8);
      std::__cxx11::string::~string((string *)&local_ce8);
      std::__cxx11::string::~string((string *)&local_d08);
      std::allocator<char>::~allocator((allocator<char> *)&local_d09);
      cmsys::SystemTools::ChangeDirectory(&this->BinaryDir);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_d50,"TimeOut",(allocator *)((long)&testLoad + 7));
    GetCTestConfiguration(&local_d30,this,&local_d50);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    iVar4 = atoi(pcVar7);
    this->TimeOut = (double)iVar4;
    std::__cxx11::string::~string((string *)&local_d30);
    std::__cxx11::string::~string((string *)&local_d50);
    std::allocator<char>::~allocator((allocator<char> *)((long)&testLoad + 7));
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_da0,"TestLoad",(allocator *)((long)&load + 7));
    GetCTestConfiguration(&local_d80,this,&local_da0);
    std::__cxx11::string::~string((string *)&local_da0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&load + 7));
    local_d60 = &local_d80;
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      pcVar7 = (char *)std::__cxx11::string::c_str();
      bVar1 = cmSystemTools::StringToULong(pcVar7,&local_db0);
      if (bVar1) {
        SetTestLoad(this,local_db0);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_f28);
        poVar6 = std::operator<<((ostream *)local_f28,"Invalid value for \'Test Load\' : ");
        poVar6 = std::operator<<(poVar6,(string *)local_d60);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        std::__cxx11::ostringstream::str();
        pcVar7 = (char *)std::__cxx11::string::c_str();
        Log(this,5,
            "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
            ,0x2b8,pcVar7,false);
        std::__cxx11::string::~string(local_f48);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_f28);
      }
    }
    if ((this->ProduceXML & 1U) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_f88,"CompressSubmission",&local_f89);
      GetCTestConfiguration(&local_f68,this,&local_f88);
      pcVar7 = (char *)std::__cxx11::string::c_str();
      bVar1 = cmSystemTools::IsOn(pcVar7);
      this->CompressXMLFiles = bVar1;
      std::__cxx11::string::~string((string *)&local_f68);
      std::__cxx11::string::~string((string *)&local_f88);
      std::allocator<char>::~allocator((allocator<char> *)&local_f89);
    }
    this_local._7_1_ = 1;
    std::__cxx11::string::~string((string *)&local_d80);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_398);
    poVar6 = std::operator<<((ostream *)local_398,"Cannot find file: ");
    poVar6 = std::operator<<(poVar6,local_38);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    pcVar7 = (char *)std::__cxx11::string::c_str();
    Log(this,6,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x282,pcVar7,false);
    std::__cxx11::string::~string(local_3b8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_398);
    this_local._7_1_ = 0;
  }
  std::__cxx11::string::~string(local_38);
LAB_0053340c:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmCTest::UpdateCTestConfiguration()
{
  if (this->SuppressUpdatingCTestConfiguration) {
    return true;
  }
  std::string fileName = this->CTestConfigFile;
  if (fileName.empty()) {
    fileName = this->BinaryDir + "/CTestConfiguration.ini";
    if (!cmSystemTools::FileExists(fileName.c_str())) {
      fileName = this->BinaryDir + "/DartConfiguration.tcl";
    }
  }
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
             "UpdateCTestConfiguration  from :" << fileName << "\n");
  if (!cmSystemTools::FileExists(fileName.c_str())) {
    // No need to exit if we are not producing XML
    if (this->ProduceXML) {
      cmCTestLog(this, ERROR_MESSAGE, "Cannot find file: " << fileName
                                                           << std::endl);
      return false;
    }
  } else {
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, "Parse Config file:" << fileName
                                                                  << "\n");
    // parse the dart test file
    cmsys::ifstream fin(fileName.c_str());

    if (!fin) {
      return false;
    }

    char buffer[1024];
    while (fin) {
      buffer[0] = 0;
      fin.getline(buffer, 1023);
      buffer[1023] = 0;
      std::string line = cmCTest::CleanString(buffer);
      if (line.empty()) {
        continue;
      }
      while (fin && (line[line.size() - 1] == '\\')) {
        line = line.substr(0, line.size() - 1);
        buffer[0] = 0;
        fin.getline(buffer, 1023);
        buffer[1023] = 0;
        line += cmCTest::CleanString(buffer);
      }
      if (line[0] == '#') {
        continue;
      }
      std::string::size_type cpos = line.find_first_of(':');
      if (cpos == std::string::npos) {
        continue;
      }
      std::string key = line.substr(0, cpos);
      std::string value = cmCTest::CleanString(line.substr(cpos + 1));
      this->CTestConfiguration[key] = value;
    }
    fin.close();
  }
  if (!this->GetCTestConfiguration("BuildDirectory").empty()) {
    this->BinaryDir = this->GetCTestConfiguration("BuildDirectory");
    cmSystemTools::ChangeDirectory(this->BinaryDir);
  }
  this->TimeOut = atoi(this->GetCTestConfiguration("TimeOut").c_str());
  std::string const& testLoad = this->GetCTestConfiguration("TestLoad");
  if (!testLoad.empty()) {
    unsigned long load;
    if (cmSystemTools::StringToULong(testLoad.c_str(), &load)) {
      this->SetTestLoad(load);
    } else {
      cmCTestLog(this, WARNING,
                 "Invalid value for 'Test Load' : " << testLoad << std::endl);
    }
  }
  if (this->ProduceXML) {
    this->CompressXMLFiles = cmSystemTools::IsOn(
      this->GetCTestConfiguration("CompressSubmission").c_str());
  }
  return true;
}